

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

time_t parse_time(char *p,size_t n)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  time_t tVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  tm tm;
  tm local_38;
  
  local_38.tm_isdst = 0;
  local_38._36_4_ = 0;
  local_38.tm_gmtoff = 0;
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_zone = (char *)0x0;
  if (n == 0x14) {
    uVar6 = (int)*p - 0x30;
    if (uVar6 < 10) {
      lVar1 = 0;
      lVar2 = 1;
      do {
        lVar1 = (ulong)uVar6 + lVar1 * 10;
        uVar6 = (int)p[lVar2] - 0x30;
        if (9 < uVar6) break;
        bVar8 = lVar2 != 4;
        lVar2 = lVar2 + 1;
      } while (bVar8);
    }
    else {
      lVar1 = 0;
    }
    if ((0x76b < lVar1) && (p[4] == '-')) {
      uVar6 = (int)p[5] - 0x30;
      if (uVar6 < 10) {
        lVar2 = 0;
        lVar7 = 0;
        do {
          lVar2 = (ulong)uVar6 + lVar2 * 10;
          uVar6 = (int)p[lVar7 + 6] - 0x30;
          if (9 < uVar6) break;
          bVar8 = lVar7 != 1;
          lVar7 = lVar7 + 1;
        } while (bVar8);
      }
      else {
        lVar2 = 0;
      }
      if ((0xfffffffffffffff3 < lVar2 - 0xdU) &&
         (local_38.tm_year = (int)lVar1 + -0x76c, local_38.tm_mon = (int)lVar2 + -1, p[7] == '-')) {
        uVar6 = (int)p[8] - 0x30;
        if (uVar6 < 10) {
          lVar1 = 0;
          lVar2 = 0;
          do {
            lVar1 = (ulong)uVar6 + lVar1 * 10;
            uVar6 = (int)p[lVar2 + 9] - 0x30;
            if (9 < uVar6) break;
            bVar8 = lVar2 != 1;
            lVar2 = lVar2 + 1;
          } while (bVar8);
        }
        else {
          lVar1 = 0;
        }
        if ((0xffffffffffffffe0 < lVar1 - 0x20U) && (p[10] == 'T')) {
          uVar6 = (int)p[0xb] - 0x30;
          if (uVar6 < 10) {
            uVar3 = 0;
            lVar2 = 0;
            do {
              uVar3 = (ulong)uVar6 + uVar3 * 10;
              uVar6 = (int)p[lVar2 + 0xc] - 0x30;
              if (9 < uVar6) break;
              bVar8 = lVar2 != 1;
              lVar2 = lVar2 + 1;
            } while (bVar8);
          }
          else {
            uVar3 = 0;
          }
          if ((uVar3 < 0x18) &&
             (local_38.tm_mday = (int)lVar1, local_38.tm_hour = (int)uVar3, p[0xd] == ':')) {
            uVar6 = (int)p[0xe] - 0x30;
            if (uVar6 < 10) {
              uVar3 = 0;
              lVar1 = 0;
              do {
                uVar3 = (ulong)uVar6 + uVar3 * 10;
                uVar6 = (int)p[lVar1 + 0xf] - 0x30;
                if (9 < uVar6) break;
                bVar8 = lVar1 != 1;
                lVar1 = lVar1 + 1;
              } while (bVar8);
            }
            else {
              uVar3 = 0;
            }
            if ((uVar3 < 0x3c) && (p[0x10] == ':')) {
              uVar6 = (int)p[0x11] - 0x30;
              if (uVar6 < 10) {
                uVar4 = 0;
                lVar1 = 0;
                do {
                  uVar4 = (ulong)uVar6 + uVar4 * 10;
                  uVar6 = (int)p[lVar1 + 0x12] - 0x30;
                  if (9 < uVar6) break;
                  bVar8 = lVar1 != 1;
                  lVar1 = lVar1 + 1;
                } while (bVar8);
              }
              else {
                uVar4 = 0;
              }
              if (uVar4 < 0x3d) {
                local_38.tm_min = (int)uVar3;
                local_38.tm_sec = (int)uVar4;
                tVar5 = timegm(&local_38);
                return tVar5;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static time_t
parse_time(const char *p, size_t n)
{
	struct tm tm;
	time_t t = 0;
	int64_t data;

	memset(&tm, 0, sizeof(tm));
	if (n != 20)
		return (t);
	data = atol10(p, 4);
	if (data < 1900)
		return (t);
	tm.tm_year = (int)data - 1900;
	p += 4;
	if (*p++ != '-')
		return (t);
	data = atol10(p, 2);
	if (data < 1 || data > 12)
		return (t);
	tm.tm_mon = (int)data -1;
	p += 2;
	if (*p++ != '-')
		return (t);
	data = atol10(p, 2);
	if (data < 1 || data > 31)
		return (t);
	tm.tm_mday = (int)data;
	p += 2;
	if (*p++ != 'T')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 23)
		return (t);
	tm.tm_hour = (int)data;
	p += 2;
	if (*p++ != ':')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 59)
		return (t);
	tm.tm_min = (int)data;
	p += 2;
	if (*p++ != ':')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 60)
		return (t);
	tm.tm_sec = (int)data;
#if 0
	p += 2;
	if (*p != 'Z')
		return (t);
#endif

	t = time_from_tm(&tm);

	return (t);
}